

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbb.cc
# Opt level: O2

void CBB_discard_child(CBB *cbb)

{
  CBB *pCVar1;
  cbb_buffer_st *pcVar2;
  
  pCVar1 = cbb->child;
  if (pCVar1 != (CBB *)0x0) {
    pcVar2 = (cbb_buffer_st *)&cbb->u;
    if (cbb->is_child != '\0') {
      pcVar2 = ((cbb_child_st *)pcVar2)->base;
    }
    if (pCVar1->is_child == '\0') {
      __assert_fail("cbb->child->is_child",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/cbb.cc"
                    ,0x1dd,"void CBB_discard_child(CBB *)");
    }
    pcVar2->len = (pCVar1->u).base.len;
    (pCVar1->u).base.buf = (uint8_t *)0x0;
    cbb->child = (CBB *)0x0;
  }
  return;
}

Assistant:

void CBB_discard_child(CBB *cbb) {
  if (cbb->child == NULL) {
    return;
  }

  struct cbb_buffer_st *base = cbb_get_base(cbb);
  assert(cbb->child->is_child);
  base->len = cbb->child->u.child.offset;

  cbb->child->u.child.base = NULL;
  cbb->child = NULL;
}